

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SamplerTest.cpp
# Opt level: O0

void __thiscall
jaegertracing::samplers::Sampler_testAdaptiveSamplerErrors_Test::TestBody
          (Sampler_testAdaptiveSamplerErrors_Test *this)

{
  initializer_list<jaegertracing::sampling_manager::thrift::OperationSamplingStrategy> __l;
  OperationSamplingStrategy *local_2a8;
  AdaptiveSampler local_290 [8];
  AdaptiveSampler sampler_1;
  AdaptiveSampler local_1e8 [8];
  AdaptiveSampler sampler;
  allocator<jaegertracing::sampling_manager::thrift::OperationSamplingStrategy> local_139;
  OperationSamplingStrategy *local_138;
  OperationSamplingStrategy local_130 [56];
  iterator local_f8;
  size_type local_f0;
  vector<jaegertracing::sampling_manager::thrift::OperationSamplingStrategy,_std::allocator<jaegertracing::sampling_manager::thrift::OperationSamplingStrategy>_>
  local_e8;
  PerOperationSamplingStrategies local_d0 [8];
  PerOperationSamplingStrategies strategies;
  vector<jaegertracing::sampling_manager::thrift::OperationSamplingStrategy,_std::allocator<jaegertracing::sampling_manager::thrift::OperationSamplingStrategy>_>
  local_b8;
  ProbabilisticSamplingStrategy local_90 [8];
  ProbabilisticSamplingStrategy probabilisticSampling;
  allocator local_69;
  string local_68 [32];
  OperationSamplingStrategy local_48 [8];
  OperationSamplingStrategy strategy;
  Sampler_testAdaptiveSamplerErrors_Test *this_local;
  
  sampling_manager::thrift::OperationSamplingStrategy::OperationSamplingStrategy(local_48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"op",&local_69);
  jaegertracing::sampling_manager::thrift::OperationSamplingStrategy::__set_operation
            ((string *)local_48);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  sampling_manager::thrift::ProbabilisticSamplingStrategy::ProbabilisticSamplingStrategy(local_90);
  jaegertracing::sampling_manager::thrift::ProbabilisticSamplingStrategy::__set_samplingRate(-0.1);
  jaegertracing::sampling_manager::thrift::OperationSamplingStrategy::__set_probabilisticSampling
            ((ProbabilisticSamplingStrategy *)local_48);
  sampling_manager::thrift::PerOperationSamplingStrategies::PerOperationSamplingStrategies(local_d0)
  ;
  jaegertracing::sampling_manager::thrift::PerOperationSamplingStrategies::
  __set_defaultSamplingProbability(0.5);
  jaegertracing::sampling_manager::thrift::PerOperationSamplingStrategies::
  __set_defaultLowerBoundTracesPerSecond(2.0);
  local_138 = local_130;
  jaegertracing::sampling_manager::thrift::OperationSamplingStrategy::OperationSamplingStrategy
            (local_138,local_48);
  local_f8 = local_130;
  local_f0 = 1;
  std::allocator<jaegertracing::sampling_manager::thrift::OperationSamplingStrategy>::allocator
            (&local_139);
  __l._M_len = local_f0;
  __l._M_array = local_f8;
  std::
  vector<jaegertracing::sampling_manager::thrift::OperationSamplingStrategy,_std::allocator<jaegertracing::sampling_manager::thrift::OperationSamplingStrategy>_>
  ::vector(&local_e8,__l,&local_139);
  jaegertracing::sampling_manager::thrift::PerOperationSamplingStrategies::
  __set_perOperationStrategies((vector *)local_d0);
  std::
  vector<jaegertracing::sampling_manager::thrift::OperationSamplingStrategy,_std::allocator<jaegertracing::sampling_manager::thrift::OperationSamplingStrategy>_>
  ::~vector(&local_e8);
  std::allocator<jaegertracing::sampling_manager::thrift::OperationSamplingStrategy>::~allocator
            (&local_139);
  local_2a8 = (OperationSamplingStrategy *)&local_f8;
  do {
    local_2a8 = local_2a8 + -0x38;
    jaegertracing::sampling_manager::thrift::OperationSamplingStrategy::~OperationSamplingStrategy
              (local_2a8);
  } while (local_2a8 != local_130);
  jaegertracing::samplers::AdaptiveSampler::AdaptiveSampler(local_1e8,local_d0,10);
  AdaptiveSampler::~AdaptiveSampler(local_1e8);
  std::
  vector<jaegertracing::sampling_manager::thrift::OperationSamplingStrategy,_std::allocator<jaegertracing::sampling_manager::thrift::OperationSamplingStrategy>_>
  ::at(&local_b8,0);
  jaegertracing::sampling_manager::thrift::ProbabilisticSamplingStrategy::__set_samplingRate(1.1);
  jaegertracing::samplers::AdaptiveSampler::AdaptiveSampler(local_290,local_d0,10);
  AdaptiveSampler::~AdaptiveSampler(local_290);
  jaegertracing::sampling_manager::thrift::PerOperationSamplingStrategies::
  ~PerOperationSamplingStrategies(local_d0);
  jaegertracing::sampling_manager::thrift::ProbabilisticSamplingStrategy::
  ~ProbabilisticSamplingStrategy(local_90);
  jaegertracing::sampling_manager::thrift::OperationSamplingStrategy::~OperationSamplingStrategy
            (local_48);
  return;
}

Assistant:

TEST(Sampler, testAdaptiveSamplerErrors)
{
    namespace thriftgen = sampling_manager::thrift;

    thriftgen::OperationSamplingStrategy strategy;
    strategy.__set_operation(kTestOperationName);
    thriftgen::ProbabilisticSamplingStrategy probabilisticSampling;
    probabilisticSampling.__set_samplingRate(-0.1);
    strategy.__set_probabilisticSampling(probabilisticSampling);

    thriftgen::PerOperationSamplingStrategies strategies;
    strategies.__set_defaultSamplingProbability(
        kTestDefaultSamplingProbability);
    strategies.__set_defaultLowerBoundTracesPerSecond(2.0);
    strategies.__set_perOperationStrategies({ strategy });

    {
        AdaptiveSampler sampler(strategies, kTestDefaultMaxOperations);
    }

    {
        strategies.perOperationStrategies.at(0)
            .probabilisticSampling.__set_samplingRate(1.1);
        AdaptiveSampler sampler(strategies, kTestDefaultMaxOperations);
    }
}